

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O2

void __thiscall
webrtc::PushSincResampler::Run(PushSincResampler *this,size_t frames,float *destination)

{
  size_t *v1;
  int16_t *piVar1;
  size_t sVar2;
  string *result;
  size_t i;
  size_t sVar3;
  size_t frames_local;
  FatalMessage local_198;
  
  v1 = &this->source_available_;
  frames_local = frames;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (v1,&frames_local,"source_available_ == frames");
  sVar2 = frames_local;
  if (result == (string *)0x0) {
    if (this->first_pass_ == true) {
      memset(destination,0,frames_local << 2);
      this->first_pass_ = false;
    }
    else {
      if (this->source_ptr_ == (float *)0x0) {
        piVar1 = this->source_ptr_int_;
        for (sVar3 = 0; frames_local != sVar3; sVar3 = sVar3 + 1) {
          destination[sVar3] = (float)(int)piVar1[sVar3];
        }
      }
      else {
        memcpy(destination,this->source_ptr_,frames_local * 4);
      }
      *v1 = *v1 - sVar2;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
             ,0x54,result);
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void PushSincResampler::Run(size_t frames, float* destination) {
  // Ensure we are only asked for the available samples. This would fail if
  // Run() was triggered more than once per Resample() call.
  RTC_CHECK_EQ(source_available_, frames);

  if (first_pass_) {
    // Provide dummy input on the first pass, the output of which will be
    // discarded, as described in Resample().
    std::memset(destination, 0, frames * sizeof(*destination));
    first_pass_ = false;
    return;
  }

  if (source_ptr_) {
    std::memcpy(destination, source_ptr_, frames * sizeof(*destination));
  } else {
    for (size_t i = 0; i < frames; ++i)
      destination[i] = static_cast<float>(source_ptr_int_[i]);
  }
  source_available_ -= frames;
}